

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmGlobalUnixMakefileGenerator3::~cmGlobalUnixMakefileGenerator3
          (cmGlobalUnixMakefileGenerator3 *this)

{
  ~cmGlobalUnixMakefileGenerator3(this);
  operator_delete(this,0x848);
  return;
}

Assistant:

cmGlobalUnixMakefileGenerator3::~cmGlobalUnixMakefileGenerator3() = default;